

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.hpp
# Opt level: O2

void __thiscall trng::mrg3s::backward(mrg3s *this)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (this->P).a[2];
  if (iVar3 == 0) {
    iVar3 = (this->P).a[1];
    if (iVar3 == 0) {
      iVar1 = (this->P).a[0];
      if (iVar1 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (this->S).r[2];
        iVar1 = int_math::modulo_inverse(iVar1,0x7fffadb3);
        iVar3 = (int)(((long)iVar1 * (long)iVar3) % 0x7fffadb3);
      }
      goto LAB_00108f6d;
    }
    iVar4 = (this->S).r[1] - (int)(((long)(this->S).r[2] * (long)(this->P).a[0]) % 0x7fffadb3);
    iVar2 = iVar4 + 0x7fffadb3;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
  }
  else {
    iVar2 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffadb3);
    iVar4 = iVar2 + 0x7fffadb3;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    iVar4 = iVar4 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffadb3);
    iVar2 = iVar4 + 0x7fffadb3;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
  }
  iVar1 = int_math::modulo_inverse(iVar3,0x7fffadb3);
  iVar3 = (int)(((long)iVar1 * (long)iVar2) % 0x7fffadb3);
LAB_00108f6d:
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  (this->S).r[2] = iVar3;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg3s::backward() {
    result_type t;
    if (P.a[2] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[2];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = t;
  }